

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_handler_MON_HOLD(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  project_monster_handler_context_t *context_local;
  
  if (((context->charm & 1U) != 0) &&
     (_Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x47,"context->mon->race->flags",
                           "RF_ANIMAL"), _Var1)) {
    context->dam = context->dam / 2 + context->dam;
  }
  if ((context->beguile & 1U) != 0) {
    context->dam = context->dam / 2 + context->dam;
  }
  context->mon_timed[6] = context->dam;
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_handler_MON_HOLD(project_monster_handler_context_t *context)
{
	if (context->charm && rf_has(context->mon->race->flags, RF_ANIMAL)) {
		context->dam += context->dam / 2;
	}
	if (context->beguile) {
		context->dam += context->dam / 2;
	}
	context->mon_timed[MON_TMD_HOLD] = context->dam;
	context->dam = 0;
}